

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall symbols::LenFunction::~LenFunction(LenFunction *this)

{
  LenFunction *this_local;
  
  ~LenFunction(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

LenFunction()
                :BuiltinFunction("len"){}